

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawShaderDrawParametersTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::Draw::anon_unknown_0::DrawTest::iterate(TestStatus *__return_storage_ptr__,DrawTest *this)

{
  uint uVar1;
  DeviceInterface *pDVar2;
  Allocation *pAVar3;
  VkCommandBuffer_s *pVVar4;
  _func_int **pp_Var5;
  Image *this_00;
  TestLog *log;
  DrawTestsBaseClass *pDVar6;
  TestStatus *pTVar7;
  uint uVar8;
  VkResult VVar9;
  VkDevice pVVar10;
  VkQueue pVVar11;
  Allocator *allocator;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  DrawTest *pDVar17;
  bool bVar18;
  undefined1 local_158 [8];
  VkDeviceMemory VStack_150;
  VkDeviceSize VStack_148;
  void *local_140;
  DrawTest *local_130;
  float local_128;
  float local_124;
  undefined8 local_120;
  undefined4 local_118;
  TestStatus *local_110;
  VkSubmitInfo submitInfo;
  float local_b8 [8];
  float local_98 [6];
  VkDeviceSize vertexBufferOffset;
  VkBuffer vertexBuffer;
  
  DrawTestsBaseClass::beginRenderPass(&this->super_DrawTestsBaseClass);
  vertexBufferOffset = 0;
  vertexBuffer.m_internal =
       (((this->super_DrawTestsBaseClass).m_vertexBuffer.m_ptr)->m_object).
       super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x58])
            (pDVar2,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1);
  pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x4c])
            (pDVar2,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->super_DrawTestsBaseClass).m_pipeline.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  uVar15 = this->m_flags;
  local_130 = this;
  if ((uVar15 & 2) != 0) {
    pDVar2 = (this->super_DrawTestsBaseClass).m_vk;
    (*pDVar2->_vptr_DeviceInterface[0x57])
              (pDVar2,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                      super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
               (((this->m_indexBuffer).m_ptr)->m_object).
               super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,0,1);
    uVar15 = this->m_flags;
  }
  pDVar17 = local_130;
  uVar1 = (uVar15 & 1) * 2 + 1;
  if ((uVar15 & 4) != 0) {
    uVar13 = (uVar15 & 0x10) >> 3;
    uVar12 = (uVar15 & 0x10) >> 4;
    uVar8 = (int)(uVar15 << 0x1b) >> 0x1f & 3;
    if ((uVar15 & 2) == 0) {
      pAVar3 = (((local_130->m_indirectBuffer).m_ptr)->m_allocation).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      submitInfo._0_8_ = &PTR__Allocation_00d50278;
      submitInfo.pNext = (void *)(pAVar3->m_memory).m_internal;
      submitInfo._16_8_ = pAVar3->m_offset;
      submitInfo.pWaitSemaphores = (VkSemaphore *)pAVar3->m_hostPtr;
      *(undefined4 *)&(submitInfo.pWaitSemaphores)->m_internal = 4;
      *(uint *)((long)&(submitInfo.pWaitSemaphores)->m_internal + 4) = uVar1;
      *(undefined4 *)&submitInfo.pWaitSemaphores[1].m_internal = 2;
      *(uint *)((long)&submitInfo.pWaitSemaphores[1].m_internal + 4) = uVar13;
      *(undefined4 *)&submitInfo.pWaitSemaphores[2].m_internal = 4;
      *(uint *)((long)&submitInfo.pWaitSemaphores[2].m_internal + 4) = uVar1;
      *(undefined4 *)&submitInfo.pWaitSemaphores[3].m_internal = 9;
      *(uint *)((long)&submitInfo.pWaitSemaphores[3].m_internal + 4) = uVar12;
      *(undefined4 *)&submitInfo.pWaitSemaphores[4].m_internal = 4;
      *(uint *)((long)&submitInfo.pWaitSemaphores[4].m_internal + 4) = uVar1;
      *(undefined4 *)&submitInfo.pWaitSemaphores[5].m_internal = 2;
      *(uint *)((long)&submitInfo.pWaitSemaphores[5].m_internal + 4) = uVar8;
      ::vk::Allocation::~Allocation((Allocation *)&submitInfo);
      pDVar2 = (pDVar17->super_DrawTestsBaseClass).m_vk;
      pVVar10 = Context::getDevice((pDVar17->super_DrawTestsBaseClass).super_TestInstance.m_context)
      ;
      pAVar3 = (((pDVar17->m_indirectBuffer).m_ptr)->m_allocation).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      submitInfo._0_8_ = &PTR__Allocation_00d50278;
      submitInfo.pNext = (void *)(pAVar3->m_memory).m_internal;
      submitInfo._16_8_ = pAVar3->m_offset;
      submitInfo.pWaitSemaphores = (VkSemaphore *)pAVar3->m_hostPtr;
      local_158 = (undefined1  [8])&PTR__Allocation_00d50278;
      VStack_150.m_internal = (pAVar3->m_memory).m_internal;
      VStack_148 = pAVar3->m_offset;
      local_140 = pAVar3->m_hostPtr;
      ::vk::flushMappedMemoryRange
                (pDVar2,pVVar10,(VkDeviceMemory)submitInfo.pNext,VStack_148,0xffffffffffffffff);
    }
    else {
      pAVar3 = (((local_130->m_indirectBuffer).m_ptr)->m_allocation).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      submitInfo._0_8_ = &PTR__Allocation_00d50278;
      submitInfo.pNext = (void *)(pAVar3->m_memory).m_internal;
      submitInfo._16_8_ = pAVar3->m_offset;
      submitInfo.pWaitSemaphores = (VkSemaphore *)pAVar3->m_hostPtr;
      *(undefined4 *)&(submitInfo.pWaitSemaphores)->m_internal = 4;
      *(uint *)((long)&(submitInfo.pWaitSemaphores)->m_internal + 4) = uVar1;
      submitInfo.pWaitSemaphores[1].m_internal = 0x10000000b;
      *(uint *)&submitInfo.pWaitSemaphores[2].m_internal = uVar13;
      *(undefined4 *)((long)&submitInfo.pWaitSemaphores[2].m_internal + 4) = 4;
      *(uint *)&submitInfo.pWaitSemaphores[3].m_internal = uVar1;
      *(undefined8 *)((long)&submitInfo.pWaitSemaphores[3].m_internal + 4) = 0x400000011;
      *(uint *)((long)&submitInfo.pWaitSemaphores[4].m_internal + 4) = uVar12;
      *(undefined4 *)&submitInfo.pWaitSemaphores[5].m_internal = 4;
      *(uint *)((long)&submitInfo.pWaitSemaphores[5].m_internal + 4) = uVar1;
      submitInfo.pWaitSemaphores[6].m_internal = 0x10000000b;
      *(uint *)&submitInfo.pWaitSemaphores[7].m_internal = uVar8;
      ::vk::Allocation::~Allocation((Allocation *)&submitInfo);
      pDVar2 = (pDVar17->super_DrawTestsBaseClass).m_vk;
      pVVar10 = Context::getDevice((pDVar17->super_DrawTestsBaseClass).super_TestInstance.m_context)
      ;
      pAVar3 = (((pDVar17->m_indirectBuffer).m_ptr)->m_allocation).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      submitInfo._0_8_ = &PTR__Allocation_00d50278;
      submitInfo.pNext = (void *)(pAVar3->m_memory).m_internal;
      submitInfo._16_8_ = pAVar3->m_offset;
      submitInfo.pWaitSemaphores = (VkSemaphore *)pAVar3->m_hostPtr;
      local_158 = (undefined1  [8])&PTR__Allocation_00d50278;
      VStack_150.m_internal = (pAVar3->m_memory).m_internal;
      VStack_148 = pAVar3->m_offset;
      local_140 = pAVar3->m_hostPtr;
      ::vk::flushMappedMemoryRange
                (pDVar2,pVVar10,(VkDeviceMemory)submitInfo.pNext,VStack_148,0xffffffffffffffff);
    }
    ::vk::Allocation::~Allocation((Allocation *)local_158);
    ::vk::Allocation::~Allocation((Allocation *)&submitInfo);
  }
  pDVar17 = local_130;
  pDVar6 = &local_130->super_DrawTestsBaseClass;
  uVar15 = local_130->m_flags;
  local_110 = __return_storage_ptr__;
  if ((uVar15 & 4) == 0) {
    pDVar2 = (local_130->super_DrawTestsBaseClass).m_vk;
    pVVar4 = (local_130->super_DrawTestsBaseClass).m_cmdBuffer.
             super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    if ((uVar15 & 2) == 0) {
      (*pDVar2->_vptr_DeviceInterface[0x59])(pDVar2,pVVar4,4,(ulong)uVar1,2,2);
    }
    else {
      (*pDVar2->_vptr_DeviceInterface[0x5a])(pDVar2,pVVar4,4,(ulong)uVar1,0xb,1,2);
    }
  }
  else {
    pDVar2 = (local_130->super_DrawTestsBaseClass).m_vk;
    pp_Var5 = pDVar2->_vptr_DeviceInterface;
    if ((uVar15 & 2) == 0) {
      (*pp_Var5[0x5b])();
    }
    else {
      (*pp_Var5[0x5c])(pDVar2,(local_130->super_DrawTestsBaseClass).m_cmdBuffer.
                              super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                       (((local_130->m_indirectBuffer).m_ptr)->m_object).
                       super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,0,
                       (ulong)(((uVar15 & 8) >> 2) + 1),0x14);
    }
  }
  pDVar2 = (pDVar17->super_DrawTestsBaseClass).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x76])
            (pDVar2,(pDVar17->super_DrawTestsBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar2 = (pDVar17->super_DrawTestsBaseClass).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x4a])
            (pDVar2,(pDVar17->super_DrawTestsBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pVVar11 = Context::getUniversalQueue
                      ((pDVar17->super_DrawTestsBaseClass).super_TestInstance.m_context);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  pDVar2 = (pDVar17->super_DrawTestsBaseClass).m_vk;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&pDVar6->m_cmdBuffer;
  VVar9 = (*pDVar2->_vptr_DeviceInterface[2])(pDVar2,pVVar11,1,&submitInfo,0);
  ::vk::checkResult(VVar9,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawShaderDrawParametersTests.cpp"
                    ,0x13b);
  pDVar2 = (pDVar17->super_DrawTestsBaseClass).m_vk;
  VVar9 = (*pDVar2->_vptr_DeviceInterface[3])(pDVar2,pVVar11);
  ::vk::checkResult(VVar9,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawShaderDrawParametersTests.cpp"
                    ,0x13c);
  submitInfo._0_8_ = ::vk::mapVkFormat((pDVar17->super_DrawTestsBaseClass).m_colorAttachmentFormat);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&vertexBufferOffset,(TextureFormat *)&submitInfo,0x100,0x100,1);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&vertexBuffer,(TextureLevel *)&vertexBufferOffset);
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = -0.3;
  local_98[3] = 0.0;
  local_98[4] = 0.0;
  local_98[5] = 0.3;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_b8[2] = -0.3;
  local_b8[3] = -0.3;
  local_b8[4] = 0.3;
  local_b8[5] = 0.3;
  submitInfo.sType = 0x3f800000;
  submitInfo._4_4_ = 0x3f800000;
  submitInfo.pNext = (void *)0x3f8000003f800000;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x3f8000003f800000;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x3f80000000000000;
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0x3f800000;
  uVar15 = pDVar17->m_flags;
  local_158._0_4_ = R;
  local_158._4_4_ = SNORM_INT8;
  VStack_150.m_internal = 0x3f80000000000000;
  tcu::clear((PixelBufferAccess *)&vertexBuffer,(Vec4 *)local_158);
  uVar16 = 0;
  do {
    local_124 = local_b8[uVar16 * 2];
    local_128 = local_b8[uVar16 * 2 + 1];
    uVar14 = 0;
    do {
      uVar1 = pDVar17->m_flags;
      tcu::getSubregion((PixelBufferAccess *)local_158,(PixelBufferAccess *)&vertexBuffer,
                        (int)((local_98[uVar14 * 2] + local_124 + 0.7) * 256.0 * 0.5),
                        (int)((local_98[uVar14 * 2 + 1] + local_128 + 0.7) * 256.0 * 0.5),0x4c,0x4c)
      ;
      uVar8 = (uint)uVar16;
      if ((uVar1 & 8) == 0) {
        uVar8 = (uint)uVar14;
      }
      tcu::clear((PixelBufferAccess *)local_158,(Vec4 *)(&submitInfo.sType + (ulong)uVar8 * 4));
      pDVar17 = local_130;
    } while (((uVar15 & 1) != 0) && (bVar18 = uVar14 < 2, uVar14 = uVar14 + 1, bVar18));
  } while (((uVar15 & 8) != 0) && (bVar18 = uVar16 < 2, uVar16 = uVar16 + 1, bVar18));
  this_00 = (local_130->super_DrawTestsBaseClass).m_colorTargetImage.m_ptr;
  pVVar11 = Context::getUniversalQueue
                      ((local_130->super_DrawTestsBaseClass).super_TestInstance.m_context);
  allocator = Context::getDefaultAllocator
                        ((pDVar17->super_DrawTestsBaseClass).super_TestInstance.m_context);
  local_118 = 0;
  local_120 = 0;
  Image::readSurface((ConstPixelBufferAccess *)&submitInfo,this_00,pVVar11,allocator,
                     VK_IMAGE_LAYOUT_GENERAL,(VkOffset3D)(ZEXT412(0) << 0x40),0x100,0x100,
                     VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  log = ((pDVar17->super_DrawTestsBaseClass).super_TestInstance.m_context)->m_testCtx->m_log;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_158,(TextureLevel *)&vertexBufferOffset);
  pTVar7 = local_110;
  bVar18 = tcu::fuzzyCompare(log,"Result","Image comparison result",
                             (ConstPixelBufferAccess *)local_158,
                             (ConstPixelBufferAccess *)&submitInfo,0.05,COMPARE_LOG_RESULT);
  local_158 = (undefined1  [8])&VStack_148;
  if (bVar18) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"OK","");
    pTVar7->m_code = QP_TEST_RESULT_PASS;
    (pTVar7->m_description)._M_dataplus._M_p = (pointer)&(pTVar7->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar7->m_description,local_158,VStack_150.m_internal + (long)local_158);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_158,"Rendered image is incorrect","");
    pTVar7->m_code = QP_TEST_RESULT_FAIL;
    (pTVar7->m_description)._M_dataplus._M_p = (pointer)&(pTVar7->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar7->m_description,local_158,VStack_150.m_internal + (long)local_158);
  }
  if (local_158 != (undefined1  [8])&VStack_148) {
    operator_delete((void *)local_158,VStack_148 + 1);
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&vertexBufferOffset);
  return pTVar7;
}

Assistant:

tcu::TestStatus DrawTest::iterate (void)
{
	// Draw
	{
		beginRenderPass();

		const vk::VkDeviceSize	vertexBufferOffset	= 0;
		const vk::VkBuffer		vertexBuffer		= m_vertexBuffer->object();

		m_vk.cmdBindVertexBuffers	(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);
		m_vk.cmdBindPipeline		(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

		if (isIndexed())
			m_vk.cmdBindIndexBuffer(*m_cmdBuffer, m_indexBuffer->object(), 0ull, vk::VK_INDEX_TYPE_UINT32);

		const deUint32			numInstances		= isInstanced() ? MAX_INSTANCE_COUNT : 1;

		if (isIndirect())
		{
			if (isIndexed())
			{
				const vk::VkDrawIndexedIndirectCommand commands[] =
				{
					// indexCount, instanceCount, firstIndex, vertexOffset, firstInstance
					{ NUM_VERTICES,	numInstances,	NDX_FIRST_INDEX,	OFFSET_FIRST_INDEX,		(isFirstInstance() ? 2u : 0u) },
					{ NUM_VERTICES,	numInstances,	NDX_SECOND_INDEX,	OFFSET_SECOND_INDEX,	(isFirstInstance() ? 1u : 0u) },
					{ NUM_VERTICES,	numInstances,	NDX_FIRST_INDEX,	OFFSET_FIRST_INDEX,		(isFirstInstance() ? 3u : 0u) },
				};
				setIndirectCommand(commands);
			}
			else
			{
				const vk::VkDrawIndirectCommand commands[] =
				{
					// vertexCount, instanceCount, firstVertex, firstInstance
					{ NUM_VERTICES,	numInstances,	NDX_FIRST_VERTEX,	(isFirstInstance() ? 2u : 0u) },
					{ NUM_VERTICES,	numInstances,	NDX_SECOND_VERTEX,	(isFirstInstance() ? 1u : 0u) },
					{ NUM_VERTICES,	numInstances,	NDX_FIRST_VERTEX,	(isFirstInstance() ? 3u : 0u) },
				};
				setIndirectCommand(commands);
			}
		}

		if (isIndirect())
		{
			const deUint32 numIndirectDraws = isMultiDraw() ? MAX_INDIRECT_DRAW_COUNT : 1;

			if (isIndexed())
				m_vk.cmdDrawIndexedIndirect(*m_cmdBuffer, m_indirectBuffer->object(), 0ull, numIndirectDraws, sizeof(vk::VkDrawIndexedIndirectCommand));
			else
				m_vk.cmdDrawIndirect(*m_cmdBuffer, m_indirectBuffer->object(), 0ull, numIndirectDraws, sizeof(vk::VkDrawIndirectCommand));
		}
		else
		{
			const deUint32 firstInstance = 2;

			if (isIndexed())
				m_vk.cmdDrawIndexed(*m_cmdBuffer, NUM_VERTICES, numInstances, NDX_FIRST_INDEX, OFFSET_FIRST_INDEX, firstInstance);
			else
				m_vk.cmdDraw(*m_cmdBuffer, NUM_VERTICES, numInstances, NDX_FIRST_VERTEX, firstInstance);
		}

		m_vk.cmdEndRenderPass(*m_cmdBuffer);
		m_vk.endCommandBuffer(*m_cmdBuffer);
	}

	// Submit
	{
		const vk::VkQueue		queue		= m_context.getUniversalQueue();
		const vk::VkSubmitInfo	submitInfo	=
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,			// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0,											// deUint32					waitSemaphoreCount;
			DE_NULL,									// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,											// deUint32					commandBufferCount;
			&m_cmdBuffer.get(),							// const VkCommandBuffer*	pCommandBuffers;
			0,											// deUint32					signalSemaphoreCount;
			DE_NULL										// const VkSemaphore*		pSignalSemaphores;
		};
		VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));
		VK_CHECK(m_vk.queueWaitIdle(queue));
	}

	// Validate
	{
		tcu::TextureLevel referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), static_cast<int>(0.5f + WIDTH), static_cast<int>(0.5f + HEIGHT));

		drawReferenceImage(referenceFrame.getAccess());

		const vk::VkOffset3D				zeroOffset		= { 0, 0, 0 };
		const tcu::ConstPixelBufferAccess	renderedFrame	= m_colorTargetImage->readSurface(m_context.getUniversalQueue(), m_context.getDefaultAllocator(),
															  vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

		if (!tcu::fuzzyCompare(m_context.getTestContext().getLog(), "Result", "Image comparison result", referenceFrame.getAccess(), renderedFrame, 0.05f, tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Rendered image is incorrect");
		else
			return tcu::TestStatus::pass("OK");
	}
}